

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteVerilog(char *pFileName,Bac_Man_t *p,int fUseAssign)

{
  void *pvVar1;
  int iVar2;
  void *pvVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  Bac_Ntk_t *p_00;
  FILE *__s;
  FILE *pFile;
  int i;
  Bac_Ntk_t *pNtk;
  int fUseAssign_local;
  Bac_Man_t *p_local;
  char *pFileName_local;
  
  if ((p->pMioLib == (void *)0x0) ||
     (pvVar1 = p->pMioLib, pvVar3 = Abc_FrameReadLibGen(), pvVar1 == pvVar3)) {
    pVVar4 = Vec_StrAlloc(10000);
    p->vOut = pVVar4;
    pVVar4 = Vec_StrAlloc(1000);
    p->vOut2 = pVVar4;
    Vec_StrPrintStr(p->vOut,"// Design \"");
    pVVar4 = p->vOut;
    pcVar5 = Bac_ManName(p);
    Vec_StrPrintStr(pVVar4,pcVar5);
    Vec_StrPrintStr(p->vOut,"\" written via CBA package in ABC on ");
    pVVar4 = p->vOut;
    pcVar5 = Extra_TimeStamp();
    Vec_StrPrintStr(pVVar4,pcVar5);
    Vec_StrPrintStr(p->vOut,"\n\n");
    Bac_ManAssignInternWordNames(p);
    for (pFile._4_4_ = 1; iVar2 = Bac_ManNtkNum(p), pFile._4_4_ <= iVar2;
        pFile._4_4_ = pFile._4_4_ + 1) {
      p_00 = Bac_ManNtk(p,pFile._4_4_);
      Bac_ManWriteVerilogNtk(p_00,fUseAssign);
    }
    if ((p->vOut != (Vec_Str_t *)0x0) && (iVar2 = Vec_StrSize(p->vOut), 0 < iVar2)) {
      __s = fopen(pFileName,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",pFileName);
      }
      else {
        pcVar5 = Vec_StrArray(p->vOut);
        iVar2 = Vec_StrSize(p->vOut);
        fwrite(pcVar5,1,(long)iVar2,__s);
        fclose(__s);
      }
    }
    Vec_StrFreeP(&p->vOut);
    Vec_StrFreeP(&p->vOut2);
  }
  else {
    printf("Genlib library used in the mapped design is not longer a current library.\n");
  }
  return;
}

Assistant:

void Bac_ManWriteVerilog( char * pFileName, Bac_Man_t * p, int fUseAssign )
{
    Bac_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    // derive the stream
    p->vOut = Vec_StrAlloc( 10000 );
    p->vOut2 = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( p->vOut, "// Design \"" );
    Vec_StrPrintStr( p->vOut, Bac_ManName(p) );
    Vec_StrPrintStr( p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( p->vOut, "\n\n" );
    Bac_ManAssignInternWordNames( p );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManWriteVerilogNtk( pNtk, fUseAssign );
    // dump into file
    if ( p->vOut && Vec_StrSize(p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(p->vOut), 1, Vec_StrSize(p->vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &p->vOut );
    Vec_StrFreeP( &p->vOut2 );
}